

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_s256_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [32];
  int iVar2;
  size_t bit;
  size_t bit_00;
  size_t bit_01;
  mzd_local_t *extraout_RDX;
  word256 *__return_storage_ptr__;
  mzd_local_t *pmVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  
  iVar2 = 2;
  local_98 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  pmVar3 = A;
  local_78 = local_98;
  while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    __return_storage_ptr__ = *(word256 **)v;
    lVar4 = 0;
    while ((int)lVar4 != 0x400) {
      auVar1 = *(undefined1 (*) [32])((long)pmVar3->w64 + lVar4);
      auVar6 = auVar1;
      mm256_compute_mask_2(__return_storage_ptr__,0,(size_t)A);
      auVar6 = vandps_avx(auVar6,auVar1);
      auVar1 = *(undefined1 (*) [32])((long)pmVar3[1].w64 + lVar4);
      auVar7 = auVar1;
      mm256_compute_mask_2(__return_storage_ptr__,2,bit);
      auVar7 = vandps_avx(auVar7,auVar1);
      auVar1 = *(undefined1 (*) [32])((long)pmVar3[2].w64 + lVar4);
      auVar8 = auVar1;
      mm256_compute_mask_2(__return_storage_ptr__,4,bit_00);
      auVar1 = vpand_avx2(auVar8,auVar1);
      local_98 = vpternlogq_avx512vl(local_98,auVar1,auVar6,0x96);
      auVar1 = *(undefined1 (*) [32])((long)pmVar3[3].w64 + lVar4);
      auVar6 = auVar1;
      mm256_compute_mask_2(__return_storage_ptr__,6,bit_01);
      auVar1 = vpand_avx2(auVar6,auVar1);
      __return_storage_ptr__ = (word256 *)((ulong)__return_storage_ptr__ >> 8);
      lVar4 = lVar4 + 0x80;
      local_78 = vpternlogq_avx512vl(local_78,auVar1,auVar7,0x96);
      A = extraout_RDX;
    }
    pmVar3 = pmVar3 + 0x20;
    v = (mzd_local_t *)((long)v + 8);
  }
  *(undefined4 *)c->w64 = local_98._16_4_ ^ local_78._16_4_ ^ local_98._0_4_ ^ local_78._0_4_;
  *(undefined4 *)((long)c->w64 + 4) = 0;
  *(undefined4 *)(c->w64 + 1) = local_98._24_4_ ^ local_78._24_4_ ^ local_98._8_4_ ^ local_78._8_4_;
  *(undefined4 *)((long)c->w64 + 0xc) =
       local_98._28_4_ ^ local_78._28_4_ ^ local_98._12_4_ ^ local_78._12_4_;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_s256_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[2] = {mm256_zero, mm256_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 8, idx >>= 8, Ablock += 4) {
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask_2(idx, 4));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask_2(idx, 6));
    }
  }
  cval[0] = mm256_xor(cval[0], cval[1]);
  mm128_store(
      cblock->w64,
      _mm256_extracti128_si256(
          mm256_xor(cval[0], _mm256_permute4x64_epi64(cval[0], _MM_SHUFFLE(3, 2, 3, 2))), 0));
}